

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeCommandListUpdateMutableCommandsExp
          (ze_command_list_handle_t hCommandList,ze_mutable_commands_exp_desc_t *desc)

{
  ze_pfnCommandListUpdateMutableCommandsExp_t pfnUpdateMutableCommandsExp;
  ze_result_t result;
  ze_mutable_commands_exp_desc_t *desc_local;
  ze_command_list_handle_t hCommandList_local;
  
  pfnUpdateMutableCommandsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c480 != (code *)0x0) {
    pfnUpdateMutableCommandsExp._4_4_ = (*DAT_0011c480)(hCommandList,desc);
  }
  return pfnUpdateMutableCommandsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandListUpdateMutableCommandsExp(
        ze_command_list_handle_t hCommandList,          ///< [in] handle of the command list
        const ze_mutable_commands_exp_desc_t* desc      ///< [in] pointer to mutable commands descriptor; multiple descriptors may
                                                        ///< be chained via `pNext` member
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnUpdateMutableCommandsExp = context.zeDdiTable.CommandListExp.pfnUpdateMutableCommandsExp;
        if( nullptr != pfnUpdateMutableCommandsExp )
        {
            result = pfnUpdateMutableCommandsExp( hCommandList, desc );
        }
        else
        {
            // generic implementation
        }

        return result;
    }